

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86_fma::forward(Padding_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  ulong uVar5;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 in_XMM1_Qa;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_10;
  Mat borderm_3;
  int z_1;
  __m128 pad_value_7;
  int q_3;
  int outd_1;
  int outh_5;
  int outw_7;
  Mat m_7;
  __m128 pad_value_6;
  Mat borderm_2;
  int q_2;
  int front__1;
  size_t out_elemsize_5;
  int out_elempack_5;
  int outc_1;
  int outh_4;
  int outw_6;
  __m128 pad_value_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int outh_3;
  int outw_5;
  __m128 pad_value_4;
  size_t out_elemsize_3;
  int out_elempack_3;
  int outw_4;
  Mat m_4;
  Mat borderm_1;
  int z;
  __m256 pad_value_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m_1;
  __m256 pad_value_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  __m256 pad_value_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  __m256 pad_value;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_9;
  Mat *m_6;
  Mat *m_3;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_11;
  Mat *m_8;
  Mat *m_5;
  Mat *m_2;
  int i_3;
  float *ptr_3;
  int size_3;
  int i_2;
  float *ptr_2;
  int size_2;
  undefined8 in_stack_ffffffffffffe928;
  int in_stack_ffffffffffffe930;
  int in_stack_ffffffffffffe934;
  Mat *in_stack_ffffffffffffe938;
  int _d;
  undefined8 *puVar11;
  int in_stack_ffffffffffffe940;
  int in_stack_ffffffffffffe944;
  undefined4 in_stack_ffffffffffffe948;
  int in_stack_ffffffffffffe94c;
  int _h;
  undefined8 in_stack_ffffffffffffe950;
  int _w;
  undefined4 in_stack_ffffffffffffe958;
  undefined4 in_stack_ffffffffffffe95c;
  Mat *in_stack_ffffffffffffe960;
  Mat *in_stack_ffffffffffffe968;
  Mat *pMVar12;
  undefined8 in_stack_ffffffffffffe970;
  undefined8 in_stack_ffffffffffffe988;
  undefined8 in_stack_ffffffffffffe990;
  Mat *in_stack_ffffffffffffe998;
  Mat *in_stack_ffffffffffffe9a0;
  int in_stack_ffffffffffffe9a8;
  Allocator *in_stack_ffffffffffffe9b0;
  Allocator *in_stack_ffffffffffffe9b8;
  undefined8 local_1620;
  undefined8 in_stack_ffffffffffffe9e8;
  int in_stack_ffffffffffffe9f0;
  int in_stack_ffffffffffffe9f4;
  Mat *in_stack_ffffffffffffe9f8;
  undefined7 in_stack_ffffffffffffea00;
  undefined1 in_stack_ffffffffffffea07;
  int in_stack_ffffffffffffea08;
  int in_stack_ffffffffffffea0c;
  undefined8 in_stack_ffffffffffffea10;
  Mat *in_stack_ffffffffffffea18;
  Mat *in_stack_ffffffffffffea20;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  int local_1550;
  int local_153c;
  int local_152c;
  undefined8 local_14a0;
  undefined8 in_stack_ffffffffffffeb68;
  undefined8 in_stack_ffffffffffffeb70;
  Mat *in_stack_ffffffffffffeb78;
  Mat *in_stack_ffffffffffffeb80;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  int local_137c;
  int local_1360;
  int local_1348;
  int local_1344;
  Option *in_stack_ffffffffffffed00;
  Mat *in_stack_ffffffffffffed08;
  Mat *in_stack_ffffffffffffed10;
  Padding *in_stack_ffffffffffffed18;
  undefined1 local_12e0 [40];
  int local_12b8;
  int local_12b4;
  int local_12b0;
  int local_12ac;
  int local_12a8;
  size_t local_12a0;
  undefined8 local_1298;
  undefined8 local_1290;
  undefined8 local_1288;
  undefined4 local_1280;
  Option *in_stack_ffffffffffffed88;
  undefined4 in_stack_ffffffffffffed90;
  undefined4 in_stack_ffffffffffffed94;
  Mat *in_stack_ffffffffffffed98;
  undefined4 uVar13;
  Padding_x86_fma *in_stack_ffffffffffffeda0;
  Mat local_1250;
  undefined8 local_1208;
  undefined8 local_1200;
  undefined8 local_11f8;
  undefined4 local_11f0;
  Allocator *local_11e8;
  undefined4 local_11e0;
  undefined4 local_11dc;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined8 local_11c8;
  Mat local_11c0;
  int local_1174;
  undefined8 local_1170;
  undefined8 uStack_1168;
  int local_1158;
  int local_1154;
  int local_1150;
  int local_114c;
  Mat local_1148;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  Mat local_10e8;
  int local_10a0;
  int local_109c;
  long local_1098;
  int local_1090;
  int local_108c;
  int local_1088;
  int local_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  long local_1068;
  int local_105c;
  int local_1058;
  int local_1054;
  undefined8 local_1050;
  undefined8 uStack_1048;
  long local_1038;
  int local_1030;
  int local_102c;
  undefined8 local_1028;
  undefined8 local_1020;
  undefined8 local_1018;
  undefined4 local_1010;
  Allocator *local_1008;
  undefined4 local_1000;
  undefined4 local_ffc;
  undefined4 local_ff8;
  undefined4 local_ff4;
  undefined4 local_ff0;
  undefined8 local_fe8;
  void *local_fe0;
  int *local_fd8;
  size_t local_fd0;
  int local_fc8;
  Allocator *local_fc0;
  undefined4 local_fb8;
  int local_fb4;
  int local_fb0;
  undefined4 local_fac;
  undefined4 local_fa8;
  long local_fa0;
  undefined8 local_f98;
  undefined8 local_f90;
  undefined8 local_f88;
  undefined4 local_f80;
  Allocator *local_f78;
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined4 local_f60;
  undefined8 local_f58;
  undefined8 *local_f50;
  int *local_f48;
  size_t local_f40;
  int local_f38;
  Allocator *local_f30;
  undefined4 local_f28;
  int local_f24;
  int local_f20;
  undefined4 local_f1c;
  undefined4 local_f18;
  long local_f10;
  int local_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  void *local_eb8;
  int *local_eb0;
  ulong local_ea8;
  int local_ea0;
  Allocator *local_e98;
  int local_e90;
  int local_e8c;
  int local_e88;
  undefined4 local_e84;
  int local_e80;
  ulong local_e78;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 *local_e28;
  int *local_e20;
  ulong local_e18;
  int local_e10;
  Allocator *local_e08;
  int local_e00;
  int local_dfc;
  int local_df8;
  undefined4 local_df4;
  int local_df0;
  ulong local_de8;
  int local_de0;
  int local_ddc;
  long local_dd8;
  int local_dd0;
  int local_dcc;
  int local_dc8;
  int local_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  long local_d98;
  int local_d8c;
  int local_d88;
  int local_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  long local_d60;
  int local_d54;
  int local_d50;
  int local_d4c;
  ulong local_d48;
  int local_d40;
  int local_d3c;
  int local_d38;
  int local_d34;
  int local_d30;
  int local_d2c;
  Mat *local_d20;
  Mat *local_d18;
  int local_d04;
  int local_d00;
  undefined4 local_cfc;
  Mat *local_cf8;
  Mat *local_cd8;
  Mat *local_cd0;
  Mat *local_cc8;
  Mat *local_cc0;
  Mat *local_cb8;
  Mat *local_cb0;
  Mat *local_ca8;
  Mat *local_ca0;
  uint local_c98;
  uint local_c94;
  uint local_c90;
  uint local_c8c;
  undefined1 local_c85;
  int local_c84;
  undefined8 *local_c78;
  undefined1 local_c6d;
  int local_c6c;
  Mat *local_c60;
  undefined1 local_c55;
  int local_c54;
  undefined8 *local_c48;
  undefined1 local_c3d;
  int local_c3c;
  undefined8 **local_c30;
  undefined8 *local_c28;
  undefined8 *local_c20;
  long *local_c18;
  long *local_c10;
  long *local_c08;
  long *local_c00;
  int local_bf4;
  undefined8 *local_bf0;
  int local_be8;
  undefined4 local_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 **local_bc0;
  int local_bb4;
  undefined8 *local_bb0;
  int local_ba8;
  undefined4 local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 **local_b78;
  undefined1 local_b6d;
  int local_b6c;
  undefined8 *local_b60;
  undefined1 local_b55;
  int local_b54;
  Mat *local_b48;
  undefined1 local_b3d;
  int local_b3c;
  undefined8 *local_b30;
  undefined1 local_b25;
  int local_b24;
  void **local_b18;
  void **local_ad0;
  undefined8 **local_ac0;
  undefined8 *local_ab0;
  undefined8 *local_aa0;
  void **local_a90;
  undefined8 **local_a80;
  Mat *local_a70;
  Mat *local_a60;
  undefined8 *local_a50;
  undefined8 *local_a40;
  Mat *local_a30;
  Mat *local_a20;
  undefined8 *local_a10;
  int local_9fc;
  undefined8 *local_9f8;
  Mat *local_9f0;
  int local_9e4;
  undefined8 *local_9e0;
  undefined8 **local_9d8;
  int local_9cc;
  undefined8 *local_9c8;
  Mat *local_9c0;
  int local_9b4;
  undefined8 *local_9b0;
  void **local_9a8;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined4 uStack_978;
  undefined4 uStack_974;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined4 local_92c;
  undefined8 *local_928;
  undefined8 *local_920;
  int local_914;
  undefined8 *local_910;
  int local_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  Mat *local_8f0;
  int local_8e4;
  undefined8 *local_8e0;
  int local_8d4;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  Mat *local_8c0;
  Option *local_8b0;
  int local_898;
  undefined4 local_894;
  undefined8 *local_890;
  int local_878;
  undefined4 local_874;
  Mat *local_870;
  int local_858;
  undefined4 local_854;
  Mat *local_850;
  undefined8 *local_830;
  undefined8 *local_810;
  int local_7f8;
  undefined4 local_7f4;
  Mat *local_7f0;
  int local_7d8;
  undefined4 local_7d4;
  Mat *local_7d0;
  int local_7b8;
  undefined4 local_7b4;
  undefined8 **local_7b0;
  int local_798;
  undefined4 local_794;
  void **local_790;
  undefined8 *local_770;
  undefined8 *local_750;
  int local_738;
  undefined4 local_734;
  undefined8 **local_730;
  int local_718;
  undefined4 local_714;
  void **local_710;
  int local_688;
  undefined4 local_684;
  void *local_678;
  void *local_630;
  undefined8 *local_620;
  void *local_5f0;
  undefined8 *local_5e0;
  void *local_5d0;
  undefined8 *local_5c0;
  void *local_590;
  undefined8 *local_580;
  void *local_570;
  Mat *local_560;
  Mat *local_558;
  undefined8 **local_550;
  undefined8 **local_548;
  Mat *local_540;
  Mat *local_538;
  Mat *local_530;
  Mat *local_528;
  Mat *local_520;
  Mat *local_518;
  Mat *local_510;
  Mat *local_508;
  undefined1 local_500 [32];
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  uint local_4c4;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint local_49c;
  uint local_498;
  uint local_494;
  uint local_490;
  uint local_48c;
  uint local_488;
  uint local_484;
  undefined1 local_480 [32];
  uint local_460;
  uint local_45c;
  uint local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  uint local_448;
  uint local_444;
  undefined1 local_440 [32];
  uint local_420;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  Allocator *local_400;
  int local_3f4;
  ulong local_3f0;
  void *local_3e8;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  void **local_3d0;
  Allocator *local_3c8;
  int local_3bc;
  size_t local_3b8;
  void *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 *local_398;
  Allocator *local_390;
  int local_384;
  ulong local_380;
  void *local_378;
  int local_36c;
  int local_368;
  int local_364;
  Mat *local_360;
  Allocator *local_358;
  int local_34c;
  size_t local_348;
  void *local_340;
  int local_334;
  int local_330;
  int local_32c;
  undefined8 *local_328;
  Allocator *local_320;
  int local_314;
  ulong local_310;
  undefined8 *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  undefined8 **local_2f0;
  Allocator *local_2e8;
  int local_2dc;
  size_t local_2d8;
  void *local_2d0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  undefined8 *local_2b8;
  Allocator *local_2b0;
  int local_2a4;
  ulong local_2a0;
  undefined8 *local_298;
  int local_28c;
  int local_288;
  int local_284;
  Mat *local_280;
  Allocator *local_278;
  int local_26c;
  size_t local_268;
  void *local_260;
  int local_254;
  int local_250;
  int local_24c;
  undefined8 *local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 *local_148;
  Allocator *local_140;
  int local_134;
  size_t local_130;
  void *local_128;
  int local_120;
  int local_11c;
  void **local_118;
  int local_104;
  size_t local_100;
  void *local_f8;
  int local_f0;
  Mat *local_e8;
  Allocator *local_e0;
  int local_d4;
  size_t local_d0;
  undefined8 *local_c8;
  int local_c0;
  int local_bc;
  undefined8 **local_b8;
  Allocator *local_b0;
  int local_a4;
  size_t local_a0;
  undefined8 *local_98;
  int local_90;
  int local_8c;
  Mat *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 *local_48;
  int local_40;
  undefined4 local_3c;
  Option *local_38;
  
  if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0)) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0)) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0 &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)))) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == 0)) {
    if (in_RDX != in_RSI) {
      if (in_RSI->refcount != (int *)0x0) {
        piVar1 = in_RSI->refcount;
        local_cfc = 1;
        LOCK();
        local_d00 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_cf8 = in_RSI;
      if (in_RDX->refcount != (int *)0x0) {
        piVar1 = in_RDX->refcount;
        local_684 = 0xffffffff;
        LOCK();
        local_688 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_688 == 1) {
          if (in_RDX->allocator == (Allocator *)0x0) {
            local_678 = in_RDX->data;
            if (local_678 != (void *)0x0) {
              free(local_678);
            }
          }
          else {
            (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
          }
        }
      }
      in_RDX->data = (void *)0x0;
      in_RDX->elemsize = 0;
      in_RDX->elempack = 0;
      in_RDX->dims = 0;
      in_RDX->w = 0;
      in_RDX->h = 0;
      in_RDX->d = 0;
      in_RDX->c = 0;
      in_RDX->cstep = 0;
      in_RDX->refcount = (int *)0x0;
      in_RDX->data = local_cf8->data;
      in_RDX->refcount = local_cf8->refcount;
      in_RDX->elemsize = local_cf8->elemsize;
      in_RDX->elempack = local_cf8->elempack;
      in_RDX->allocator = local_cf8->allocator;
      in_RDX->dims = local_cf8->dims;
      in_RDX->w = local_cf8->w;
      in_RDX->h = local_cf8->h;
      in_RDX->d = local_cf8->d;
      in_RDX->c = local_cf8->c;
      in_RDX->cstep = local_cf8->cstep;
    }
    local_d04 = 0;
  }
  else {
    if (in_RSI->elempack == 0) {
      local_1344 = 0;
    }
    else {
      uVar5 = in_RSI->elemsize << 3;
      local_1344 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                        (long)in_RSI->elempack);
    }
    local_d2c = local_1344;
    if (local_1344 == 8) {
      local_d04 = forward_int8(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,
                               (Mat *)CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
                               in_stack_ffffffffffffed88);
    }
    else {
      local_d30 = in_RSI->w;
      local_d34 = in_RSI->h;
      local_d38 = in_RSI->d;
      local_d3c = in_RSI->c;
      local_d40 = in_RSI->dims;
      local_d48 = in_RSI->elemsize;
      local_d4c = in_RSI->elempack;
      _w = (int)((ulong)in_stack_ffffffffffffe950 >> 0x20);
      _h = (int)in_stack_ffffffffffffe950;
      _d = (int)((ulong)in_stack_ffffffffffffe938 >> 0x20);
      local_d20 = in_RDX;
      local_d18 = in_RSI;
      if (local_d4c == 8) {
        if (local_d40 == 1) {
          local_d50 = local_d30 * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          if (local_d50 % 8 == 0) {
            local_1348 = 8;
          }
          else {
            local_1348 = 1;
            if (local_d50 % 4 == 0) {
              local_1348 = 4;
            }
          }
          local_d54 = local_1348;
          local_d60 = (local_d48 / 8) * (long)local_1348;
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 8 == 0) &&
              (local_1348 == 8)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),_w,
                        CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                        in_stack_ffffffffffffe944,(Allocator *)in_stack_ffffffffffffe938);
            local_ca0 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_540 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              local_c8c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              auVar3 = vinsertps_avx(ZEXT416(local_c8c),ZEXT416(local_c8c),0x10);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c8c),0x20);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c8c),0x30);
              auVar4 = vinsertps_avx(ZEXT416(local_c8c),ZEXT416(local_c8c),0x10);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c8c),0x20);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c8c),0x30);
              auVar7._16_16_ = auVar3;
              auVar7._0_16_ = auVar4;
              local_500._0_8_ = auVar4._0_8_;
              local_500._8_8_ = auVar4._8_8_;
              local_500._16_8_ = auVar3._0_8_;
              local_500._24_8_ = auVar3._8_8_;
              local_d80 = local_500._0_8_;
              uStack_d78 = local_500._8_8_;
              uStack_d70 = local_500._16_8_;
              uStack_d68 = local_500._24_8_;
              v[1] = (float)in_stack_ffffffffffffe95c;
              v[0] = (float)in_stack_ffffffffffffe958;
              v._8_8_ = in_stack_ffffffffffffe960;
              v._16_8_ = in_stack_ffffffffffffe968;
              v[6] = (float)(int)in_stack_ffffffffffffe970;
              v[7] = (float)(int)((ulong)in_stack_ffffffffffffe970 >> 0x20);
              local_500 = auVar7;
              local_4e0 = local_c8c;
              local_4dc = local_c8c;
              local_4d8 = local_c8c;
              local_4d4 = local_c8c;
              local_4d0 = local_c8c;
              local_4cc = local_c8c;
              local_4c8 = local_c8c;
              local_4c4 = local_c8c;
              padding_constant_pack8_avx
                        (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                         (int)((ulong)in_stack_ffffffffffffe990 >> 0x20),
                         (int)in_stack_ffffffffffffe990,
                         (int)((ulong)in_stack_ffffffffffffe988 >> 0x20),
                         (int)in_stack_ffffffffffffe988,v);
              return 0;
            }
            return -100;
          }
        }
        if (local_d40 == 2) {
          local_d84 = local_d30 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_d88 = local_d34 * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          if (local_d88 % 8 == 0) {
            local_1360 = 8;
          }
          else {
            local_1360 = 1;
            if (local_d88 % 4 == 0) {
              local_1360 = 4;
            }
          }
          local_d8c = local_1360;
          local_d98 = (local_d48 / 8) * (long)local_1360;
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) &&
              (local_1360 == 8)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),_w,_h,
                        CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                        in_stack_ffffffffffffe944,(Allocator *)in_stack_ffffffffffffe938);
            local_ca8 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_538 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              local_c90 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              auVar3 = vinsertps_avx(ZEXT416(local_c90),ZEXT416(local_c90),0x10);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c90),0x20);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c90),0x30);
              auVar4 = vinsertps_avx(ZEXT416(local_c90),ZEXT416(local_c90),0x10);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c90),0x20);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c90),0x30);
              auVar8._16_16_ = auVar3;
              auVar8._0_16_ = auVar4;
              local_4c0._0_8_ = auVar4._0_8_;
              local_4c0._8_8_ = auVar4._8_8_;
              local_4c0._16_8_ = auVar3._0_8_;
              local_4c0._24_8_ = auVar3._8_8_;
              local_dc0 = local_4c0._0_8_;
              uStack_db8 = local_4c0._8_8_;
              uStack_db0 = local_4c0._16_8_;
              uStack_da8 = local_4c0._24_8_;
              v_00[1] = (float)in_stack_ffffffffffffe95c;
              v_00[0] = (float)in_stack_ffffffffffffe958;
              v_00._8_8_ = in_stack_ffffffffffffe960;
              v_00._16_8_ = in_stack_ffffffffffffe968;
              v_00[6] = (float)(int)in_stack_ffffffffffffe970;
              v_00[7] = (float)(int)((ulong)in_stack_ffffffffffffe970 >> 0x20);
              local_4c0 = auVar8;
              local_4a0 = local_c90;
              local_49c = local_c90;
              local_498 = local_c90;
              local_494 = local_c90;
              local_490 = local_c90;
              local_48c = local_c90;
              local_488 = local_c90;
              local_484 = local_c90;
              padding_constant_pack8_avx
                        (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                         (int)((ulong)in_stack_ffffffffffffe990 >> 0x20),
                         (int)in_stack_ffffffffffffe990,
                         (int)((ulong)in_stack_ffffffffffffe988 >> 0x20),
                         (int)in_stack_ffffffffffffe988,v_00);
              return 0;
            }
            return -100;
          }
        }
        if (local_d40 == 3) {
          local_dc4 = local_d30 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_dc8 = local_d34 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_dcc = local_d3c * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (local_dcc % 8 == 0) {
            local_137c = 8;
          }
          else {
            local_137c = 1;
            if (local_dcc % 4 == 0) {
              local_137c = 4;
            }
          }
          local_dd0 = local_137c;
          local_dd8 = (local_d48 / 8) * (long)local_137c;
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 8 == 0) &&
              (local_137c == 8)) &&
             ((local_dcc == local_d3c * 8 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),_w,_h,
                        in_stack_ffffffffffffe94c,
                        CONCAT44(in_stack_ffffffffffffe944,in_stack_ffffffffffffe940),_d,
                        in_stack_ffffffffffffe9b8);
            local_cb0 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_530 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              local_ddc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / local_d4c;
              for (local_de0 = 0; local_de0 < local_dcc / local_dd0; local_de0 = local_de0 + 1) {
                local_c30 = &local_e28;
                local_2f4 = local_d20->w;
                local_2f8 = local_d20->h;
                local_2fc = local_d20->d;
                local_308 = (undefined8 *)
                            ((long)local_d20->data +
                            local_d20->cstep * (long)local_de0 * local_d20->elemsize);
                local_310 = local_d20->elemsize;
                local_314 = local_d20->elempack;
                local_320 = local_d20->allocator;
                local_2f0 = &local_e28;
                local_e20 = (int *)0x0;
                local_df4 = 1;
                local_208 = (long)local_2f4 * (long)local_2f8 * local_310;
                local_de8 = (local_208 + 0xfU & 0xfffffffffffffff0) / local_310;
                local_e00 = local_d20->dims + -1;
                if (local_d20->dims == 4) {
                  local_de8 = (long)local_d20->w * (long)local_d20->h;
                }
                local_20c = 0x10;
                local_c3c = local_de0;
                local_c3d = 1;
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  local_c94 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  auVar3 = vinsertps_avx(ZEXT416(local_c94),ZEXT416(local_c94),0x10);
                  auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c94),0x20);
                  auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c94),0x30);
                  auVar4 = vinsertps_avx(ZEXT416(local_c94),ZEXT416(local_c94),0x10);
                  auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c94),0x20);
                  auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c94),0x30);
                  auVar9._16_16_ = auVar3;
                  auVar9._0_16_ = auVar4;
                  local_480._0_8_ = auVar4._0_8_;
                  local_480._8_8_ = auVar4._8_8_;
                  local_480._16_8_ = auVar3._0_8_;
                  local_480._24_8_ = auVar3._8_8_;
                  local_1400 = local_480._0_8_;
                  uStack_13f8 = local_480._8_8_;
                  uStack_13f0 = local_480._16_8_;
                  uStack_13e8 = local_480._24_8_;
                  local_480 = auVar9;
                  local_460 = local_c94;
                  local_45c = local_c94;
                  local_458 = local_c94;
                  local_454 = local_c94;
                  local_450 = local_c94;
                  local_44c = local_c94;
                  local_448 = local_c94;
                  local_444 = local_c94;
                }
                else {
                  local_c00 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
                  local_c20 = (undefined8 *)(*local_c00 + (long)(local_de0 << 3) * 4);
                  local_1400 = *local_c20;
                  uStack_13f8 = local_c20[1];
                  uStack_13f0 = local_c20[2];
                  uStack_13e8 = local_c20[3];
                }
                local_e60 = local_1400;
                uStack_e58 = uStack_13f8;
                uStack_e50 = uStack_13f0;
                uStack_e48 = uStack_13e8;
                local_e28 = local_308;
                local_e18 = local_310;
                local_e10 = local_314;
                local_e08 = local_320;
                local_dfc = local_2f4;
                local_df8 = local_2f8;
                local_df0 = local_2fc;
                if ((local_de0 - local_ddc < 0) || (local_d3c <= local_de0 - local_ddc)) {
                  local_b78 = &local_e28;
                  local_ba0 = local_1400;
                  uStack_b98 = uStack_13f8;
                  uStack_b90 = uStack_13f0;
                  uStack_b88 = uStack_13e8;
                  local_ba4 = 0;
                  local_ba8 = (int)local_de8 * local_2fc;
                  local_bb0 = local_308;
                  for (local_bb4 = 0; local_550 = local_b78, local_bb4 < local_ba8;
                      local_bb4 = local_bb4 + 1) {
                    local_188 = local_bb0;
                    local_1c0 = local_1400;
                    uStack_1b8 = uStack_13f8;
                    uStack_1b0 = uStack_13f0;
                    uStack_1a8 = uStack_13e8;
                    *local_bb0 = local_1400;
                    local_bb0[1] = uStack_13f8;
                    local_bb0[2] = uStack_13f0;
                    local_bb0[3] = uStack_13e8;
                    local_bb0 = local_bb0 + 4;
                  }
                }
                else {
                  local_b24 = local_de0 - local_ddc;
                  local_b18 = &local_eb8;
                  local_3d4 = local_d18->w;
                  local_3d8 = local_d18->h;
                  local_3dc = local_d18->d;
                  local_3e8 = (void *)((long)local_d18->data +
                                      local_d18->cstep * (long)local_b24 * local_d18->elemsize);
                  local_3f0 = local_d18->elemsize;
                  local_3f4 = local_d18->elempack;
                  local_400 = local_d18->allocator;
                  local_3d0 = &local_eb8;
                  local_eb0 = (int *)0x0;
                  local_e84 = 1;
                  local_1c8 = (long)local_3d4 * (long)local_3d8 * local_3f0;
                  local_e78 = (local_1c8 + 0xfU & 0xfffffffffffffff0) / local_3f0;
                  local_e90 = local_d18->dims + -1;
                  if (local_d18->dims == 4) {
                    local_e78 = (long)local_d18->w * (long)local_d18->h;
                  }
                  local_1cc = 0x10;
                  local_20c = 0x10;
                  local_b25 = 1;
                  local_c3d = 1;
                  local_eb8 = local_3e8;
                  local_ea8 = local_3f0;
                  local_ea0 = local_3f4;
                  local_e98 = local_400;
                  local_e8c = local_3d4;
                  local_e88 = local_3d8;
                  local_e80 = local_3dc;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                    v_01[1] = (float)in_stack_ffffffffffffe95c;
                    v_01[0] = (float)in_stack_ffffffffffffe958;
                    v_01._8_8_ = in_stack_ffffffffffffe960;
                    v_01._16_8_ = in_stack_ffffffffffffe968;
                    v_01[6] = (float)(int)in_stack_ffffffffffffe970;
                    v_01[7] = (float)(int)((ulong)in_stack_ffffffffffffe970 >> 0x20);
                    padding_constant_pack8_avx
                              (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                               (int)((ulong)in_stack_ffffffffffffe990 >> 0x20),
                               (int)in_stack_ffffffffffffe990,
                               (int)((ulong)in_stack_ffffffffffffe988 >> 0x20),
                               (int)in_stack_ffffffffffffe988,v_01);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                    padding_replicate_pack8_avx
                              (in_stack_ffffffffffffea20,in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20),
                               (int)in_stack_ffffffffffffea10,in_stack_ffffffffffffea0c,
                               in_stack_ffffffffffffea08);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                    padding_reflect_pack8_avx
                              (in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
                               (int)((ulong)in_stack_ffffffffffffeb70 >> 0x20),
                               (int)in_stack_ffffffffffffeb70,
                               (int)((ulong)in_stack_ffffffffffffeb68 >> 0x20),
                               (int)in_stack_ffffffffffffeb68);
                  }
                  local_ad0 = &local_eb8;
                  local_710 = local_ad0;
                  if (local_eb0 != (int *)0x0) {
                    local_714 = 0xffffffff;
                    LOCK();
                    local_718 = *local_eb0;
                    *local_eb0 = *local_eb0 + -1;
                    UNLOCK();
                    if (local_718 == 1) {
                      if (local_e98 == (Allocator *)0x0) {
                        local_630 = local_eb8;
                        if (local_eb8 != (void *)0x0) {
                          free(local_eb8);
                        }
                      }
                      else {
                        (*local_e98->_vptr_Allocator[3])(local_e98,local_eb8);
                      }
                    }
                  }
                  local_eb8 = (void *)0x0;
                  local_ea8 = 0;
                  local_ea0 = 0;
                  local_e90 = 0;
                  local_e8c = 0;
                  local_e88 = 0;
                  local_e84 = 0;
                  local_e80 = 0;
                  local_e78 = 0;
                  local_eb0 = (int *)0x0;
                }
                local_ac0 = &local_e28;
                local_730 = local_ac0;
                if (local_e20 != (int *)0x0) {
                  local_734 = 0xffffffff;
                  LOCK();
                  local_738 = *local_e20;
                  *local_e20 = *local_e20 + -1;
                  UNLOCK();
                  if (local_738 == 1) {
                    if (local_e08 == (Allocator *)0x0) {
                      local_620 = local_e28;
                      if (local_e28 != (undefined8 *)0x0) {
                        free(local_e28);
                      }
                    }
                    else {
                      (*local_e08->_vptr_Allocator[3])(local_e08,local_e28);
                    }
                  }
                }
              }
              return 0;
            }
            return -100;
          }
        }
        if (local_d40 == 4) {
          local_ebc = local_d30 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_ec0 = local_d34 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_ec4 = local_d38 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                        in_stack_ffffffffffffe944,in_stack_ffffffffffffe940,_d,
                        (int)in_stack_ffffffffffffe938,
                        CONCAT44(in_stack_ffffffffffffe934,in_stack_ffffffffffffe930),
                        in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9b0);
            local_cb8 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_528 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              for (local_ec8 = 0; local_ec8 < local_d3c; local_ec8 = local_ec8 + 1) {
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  local_c98 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  auVar3 = vinsertps_avx(ZEXT416(local_c98),ZEXT416(local_c98),0x10);
                  auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c98),0x20);
                  auVar3 = vinsertps_avx(auVar3,ZEXT416(local_c98),0x30);
                  auVar4 = vinsertps_avx(ZEXT416(local_c98),ZEXT416(local_c98),0x10);
                  auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c98),0x20);
                  auVar4 = vinsertps_avx(auVar4,ZEXT416(local_c98),0x30);
                  auVar10._16_16_ = auVar3;
                  auVar10._0_16_ = auVar4;
                  local_440._0_8_ = auVar4._0_8_;
                  local_440._8_8_ = auVar4._8_8_;
                  local_440._16_8_ = auVar3._0_8_;
                  local_440._24_8_ = auVar3._8_8_;
                  local_14a0 = local_440._0_8_;
                  uStack_ef8 = local_440._8_8_;
                  uStack_ef0 = local_440._16_8_;
                  uStack_ee8 = local_440._24_8_;
                  local_440 = auVar10;
                  local_420 = local_c98;
                  local_41c = local_c98;
                  local_418 = local_c98;
                  local_414 = local_c98;
                  local_410 = local_c98;
                  local_40c = local_c98;
                  local_408 = local_c98;
                  local_404 = local_c98;
                }
                else {
                  local_c08 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
                  local_c28 = (undefined8 *)(*local_c08 + (long)(local_ec8 << 3) * 4);
                  local_14a0 = *local_c28;
                  uStack_ef8 = local_c28[1];
                  uStack_ef0 = local_c28[2];
                  uStack_ee8 = local_c28[3];
                }
                local_f00 = local_14a0;
                for (local_f04 = 0; local_f04 < local_ec4; local_f04 = local_f04 + 1) {
                  local_c48 = &local_f98;
                  local_2bc = local_d20->w;
                  local_2c0 = local_d20->h;
                  local_2c4 = local_d20->d;
                  local_2d0 = (void *)((long)local_d20->data +
                                      local_d20->cstep * (long)local_ec8 * local_d20->elemsize);
                  local_2d8 = local_d20->elemsize;
                  local_2dc = local_d20->elempack;
                  local_2e8 = local_d20->allocator;
                  local_2b8 = &local_f98;
                  local_218 = (long)local_2bc * (long)local_2c0 * local_2d8;
                  local_9d8 = &local_f50;
                  local_9e0 = &local_f98;
                  local_c8 = (undefined8 *)
                             ((long)local_2d0 +
                             (long)local_2bc * (long)local_2c0 * (long)local_f04 * local_2d8);
                  local_b8 = &local_f50;
                  local_f10 = (long)local_2bc * (long)local_2c0;
                  local_ab0 = &local_f98;
                  local_f18 = 1;
                  local_f1c = 1;
                  local_f28 = 2;
                  local_f48 = (int *)0x0;
                  local_21c = 0x10;
                  local_9e4 = local_f04;
                  local_c54 = local_ec8;
                  local_c55 = 1;
                  local_f98 = 0;
                  local_f88 = 0;
                  local_f80 = 0;
                  local_f70 = 0;
                  local_f6c = 0;
                  local_f68 = 0;
                  local_f64 = 0;
                  local_f60 = 0;
                  local_f58 = 0;
                  local_f90 = 0;
                  local_750 = local_ab0;
                  local_e0 = local_2e8;
                  local_d4 = local_2dc;
                  local_d0 = local_2d8;
                  local_c0 = local_2c0;
                  local_bc = local_2bc;
                  local_f78 = local_2e8;
                  local_f50 = local_c8;
                  local_f40 = local_2d8;
                  local_f38 = local_2dc;
                  local_f30 = local_2e8;
                  local_f24 = local_2bc;
                  local_f20 = local_2c0;
                  if ((local_f04 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0)
                     || (local_d38 <=
                         local_f04 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8))) {
                    local_bc0 = &local_f50;
                    local_be0 = local_f00;
                    uStack_bd8 = uStack_ef8;
                    uStack_bd0 = uStack_ef0;
                    uStack_bc8 = uStack_ee8;
                    local_be4 = 0;
                    local_be8 = (int)local_f10;
                    local_bf0 = local_c8;
                    for (local_bf4 = 0; local_548 = local_bc0, local_bf4 < local_be8;
                        local_bf4 = local_bf4 + 1) {
                      local_148 = local_bf0;
                      local_180 = local_f00;
                      uStack_178 = uStack_ef8;
                      uStack_170 = uStack_ef0;
                      uStack_168 = uStack_ee8;
                      *local_bf0 = local_f00;
                      local_bf0[1] = uStack_ef8;
                      local_bf0[2] = uStack_ef0;
                      local_bf0[3] = uStack_ee8;
                      local_bf0 = local_bf0 + 4;
                    }
                  }
                  else {
                    local_b30 = &local_1028;
                    local_39c = local_d18->w;
                    local_3a0 = local_d18->h;
                    local_3a4 = local_d18->d;
                    local_3b0 = (void *)((long)local_d18->data +
                                        local_d18->cstep * (long)local_ec8 * local_d18->elemsize);
                    local_3b8 = local_d18->elemsize;
                    local_3bc = local_d18->elempack;
                    local_3c8 = local_d18->allocator;
                    local_398 = &local_1028;
                    local_1d8 = (long)local_39c * (long)local_3a0 * local_3b8;
                    local_9b4 = local_f04 -
                                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8);
                    local_9a8 = &local_fe0;
                    local_9b0 = &local_1028;
                    local_128 = (void *)((long)local_3b0 +
                                        (long)local_39c * (long)local_3a0 * (long)local_9b4 *
                                        local_3b8);
                    local_118 = &local_fe0;
                    local_fa0 = (long)local_39c * (long)local_3a0;
                    local_aa0 = &local_1028;
                    local_f18 = 1;
                    local_f1c = 1;
                    local_f28 = 2;
                    local_f48 = (int *)0x0;
                    local_f60 = 0;
                    local_f64 = 0;
                    local_f68 = 0;
                    local_f6c = 0;
                    local_f80 = 0;
                    local_f88 = 0;
                    local_f90 = 0;
                    local_f98 = 0;
                    local_fa8 = 1;
                    local_fac = 1;
                    local_fb8 = 2;
                    local_fd8 = (int *)0x0;
                    local_1dc = 0x10;
                    local_21c = 0x10;
                    local_b3c = local_ec8;
                    local_b3d = 1;
                    local_c55 = 1;
                    local_f58 = 0;
                    local_f70 = 0;
                    local_1028 = 0;
                    local_1018 = 0;
                    local_1010 = 0;
                    local_1000 = 0;
                    local_ffc = 0;
                    local_ff8 = 0;
                    local_ff4 = 0;
                    local_ff0 = 0;
                    local_fe8 = 0;
                    local_1020 = 0;
                    v_02[1] = (float)in_stack_ffffffffffffe95c;
                    v_02[0] = (float)in_stack_ffffffffffffe958;
                    v_02._8_8_ = in_stack_ffffffffffffe960;
                    v_02._16_8_ = in_stack_ffffffffffffe968;
                    v_02[6] = (float)(int)in_stack_ffffffffffffe970;
                    v_02[7] = (float)(int)((ulong)in_stack_ffffffffffffe970 >> 0x20);
                    local_770 = local_aa0;
                    local_140 = local_3c8;
                    local_134 = local_3bc;
                    local_130 = local_3b8;
                    local_120 = local_3a0;
                    local_11c = local_39c;
                    local_1008 = local_3c8;
                    local_fe0 = local_128;
                    local_fd0 = local_3b8;
                    local_fc8 = local_3bc;
                    local_fc0 = local_3c8;
                    local_fb4 = local_39c;
                    local_fb0 = local_3a0;
                    padding_constant_pack8_avx
                              (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                               (int)((ulong)in_stack_ffffffffffffe990 >> 0x20),
                               (int)in_stack_ffffffffffffe990,
                               (int)((ulong)in_stack_ffffffffffffe988 >> 0x20),
                               (int)in_stack_ffffffffffffe988,v_02);
                    local_a90 = &local_fe0;
                    local_790 = local_a90;
                    if (local_fd8 != (int *)0x0) {
                      local_794 = 0xffffffff;
                      LOCK();
                      local_798 = *local_fd8;
                      *local_fd8 = *local_fd8 + -1;
                      UNLOCK();
                      if (local_798 == 1) {
                        if (local_fc0 == (Allocator *)0x0) {
                          local_5f0 = local_fe0;
                          if (local_fe0 != (void *)0x0) {
                            free(local_fe0);
                          }
                        }
                        else {
                          (*local_fc0->_vptr_Allocator[3])(local_fc0,local_fe0);
                        }
                      }
                    }
                    local_fe0 = (void *)0x0;
                    local_fd0 = 0;
                    local_fc8 = 0;
                    local_fb8 = 0;
                    local_fb4 = 0;
                    local_fb0 = 0;
                    local_fac = 0;
                    local_fa8 = 0;
                    local_fa0 = 0;
                    local_fd8 = (int *)0x0;
                  }
                  local_a80 = &local_f50;
                  local_7b0 = local_a80;
                  if (local_f48 != (int *)0x0) {
                    local_7b4 = 0xffffffff;
                    LOCK();
                    local_7b8 = *local_f48;
                    *local_f48 = *local_f48 + -1;
                    UNLOCK();
                    if (local_7b8 == 1) {
                      if (local_f30 == (Allocator *)0x0) {
                        local_5e0 = local_f50;
                        if (local_f50 != (undefined8 *)0x0) {
                          free(local_f50);
                        }
                      }
                      else {
                        (*local_f30->_vptr_Allocator[3])(local_f30,local_f50);
                      }
                    }
                  }
                }
              }
              return 0;
            }
            return -100;
          }
        }
      }
      if (local_d4c == 4) {
        if (local_d40 == 1) {
          local_102c = local_d30 * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          if (local_102c % 8 == 0) {
            local_152c = 8;
          }
          else {
            local_152c = 1;
            if (local_102c % 4 == 0) {
              local_152c = 4;
            }
          }
          local_1030 = local_152c;
          local_1038 = (local_d48 / 4) * (long)local_152c;
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 4 == 0) &&
              (local_152c == 4)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),_w,
                        CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                        in_stack_ffffffffffffe944,(Allocator *)in_stack_ffffffffffffe938);
            local_cc0 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_520 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              local_940 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              local_1050 = CONCAT44(local_940,local_940);
              uStack_1048 = CONCAT44(local_940,local_940);
              v_03[2] = (float)(int)in_XMM1_Qa;
              v_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              v_03[0] = (float)local_940;
              v_03[1] = (float)local_940;
              uStack_93c = local_940;
              uStack_938 = local_940;
              uStack_934 = local_940;
              local_92c = local_940;
              padding_constant_pack4_sse
                        (local_d18,local_d20,0,0,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / 4,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) / 4,v_03);
              return 0;
            }
            return -100;
          }
        }
        if (local_d40 == 2) {
          local_1054 = local_d30 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_1058 = local_d34 * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          if (local_1058 % 8 == 0) {
            local_153c = 8;
          }
          else {
            local_153c = 1;
            if (local_1058 % 4 == 0) {
              local_153c = 4;
            }
          }
          local_105c = local_153c;
          local_1068 = (local_d48 / 4) * (long)local_153c;
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) &&
              (local_153c == 4)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),_w,_h,
                        CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                        in_stack_ffffffffffffe944,(Allocator *)in_stack_ffffffffffffe938);
            local_cc8 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_518 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              local_960 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              local_1080 = CONCAT44(local_960,local_960);
              uStack_1078 = CONCAT44(local_960,local_960);
              v_04[2] = (float)(int)in_XMM1_Qa;
              v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              v_04[0] = (float)local_960;
              v_04[1] = (float)local_960;
              uStack_95c = local_960;
              uStack_958 = local_960;
              uStack_954 = local_960;
              local_944 = local_960;
              padding_constant_pack4_sse
                        (local_d18,local_d20,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / 4,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 4,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc),v_04);
              return 0;
            }
            return -100;
          }
        }
        if (local_d40 == 3) {
          local_1084 = local_d30 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_1088 = local_d34 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_108c = local_d3c * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (local_108c % 8 == 0) {
            local_1550 = 8;
          }
          else {
            local_1550 = 1;
            if (local_108c % 4 == 0) {
              local_1550 = 4;
            }
          }
          local_1090 = local_1550;
          local_1098 = (local_d48 / 4) * (long)local_1550;
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 4 == 0) &&
              (local_1550 == 4)) &&
             ((local_108c == local_d3c * 4 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),_w,_h,
                        in_stack_ffffffffffffe94c,
                        CONCAT44(in_stack_ffffffffffffe944,in_stack_ffffffffffffe940),_d,
                        in_stack_ffffffffffffe9b8);
            local_cd0 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_510 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              local_109c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / local_d4c;
              for (local_10a0 = 0; local_10a0 < local_108c / local_1090; local_10a0 = local_10a0 + 1
                  ) {
                local_c60 = &local_10e8;
                local_284 = local_d20->w;
                local_288 = local_d20->h;
                local_28c = local_d20->d;
                local_298 = (undefined8 *)
                            ((long)local_d20->data +
                            local_d20->cstep * (long)local_10a0 * local_d20->elemsize);
                local_2a0 = local_d20->elemsize;
                local_2a4 = local_d20->elempack;
                local_2b0 = local_d20->allocator;
                local_280 = &local_10e8;
                local_10e8.refcount = (int *)0x0;
                local_10e8.d = 1;
                local_228 = (long)local_284 * (long)local_288 * local_2a0;
                local_10e8.cstep = (local_228 + 0xfU & 0xfffffffffffffff0) / local_2a0;
                local_10e8.dims = local_d20->dims + -1;
                if (local_d20->dims == 4) {
                  local_10e8.cstep = (long)local_d20->w * (long)local_d20->h;
                }
                local_22c = 0x10;
                local_c6c = local_10a0;
                local_c6d = 1;
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  local_980 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  local_15b0 = CONCAT44(local_980,local_980);
                  uStack_15a8 = CONCAT44(local_980,local_980);
                  uStack_97c = local_980;
                  uStack_978 = local_980;
                  uStack_974 = local_980;
                  local_964 = local_980;
                }
                else {
                  local_c10 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
                  local_920 = (undefined8 *)(*local_c10 + (long)(local_10a0 << 2) * 4);
                  local_15b0 = *local_920;
                  uStack_15a8 = local_920[1];
                }
                local_1100 = local_15b0;
                uStack_10f8 = uStack_15a8;
                local_10e8.data = local_298;
                local_10e8.elemsize = local_2a0;
                local_10e8.elempack = local_2a4;
                local_10e8.allocator = local_2b0;
                local_10e8.w = local_284;
                local_10e8.h = local_288;
                local_10e8.c = local_28c;
                if ((local_10a0 - local_109c < 0) || (local_d3c <= local_10a0 - local_109c)) {
                  local_8c0 = &local_10e8;
                  local_8d0 = local_15b0;
                  uStack_8c8 = uStack_15a8;
                  local_8d4 = (int)local_10e8.cstep * local_28c;
                  local_8e0 = local_298;
                  for (local_8e4 = 0; local_560 = local_8c0, local_8e4 < local_8d4;
                      local_8e4 = local_8e4 + 1) {
                    local_68 = local_8e0;
                    local_80 = local_15b0;
                    uStack_78 = uStack_15a8;
                    *local_8e0 = local_15b0;
                    local_8e0[1] = uStack_15a8;
                    local_8e0 = local_8e0 + 2;
                  }
                }
                else {
                  local_b54 = local_10a0 - local_109c;
                  local_b48 = &local_1148;
                  local_364 = local_d18->w;
                  local_368 = local_d18->h;
                  local_36c = local_d18->d;
                  local_378 = (void *)((long)local_d18->data +
                                      local_d18->cstep * (long)local_b54 * local_d18->elemsize);
                  local_380 = local_d18->elemsize;
                  local_384 = local_d18->elempack;
                  local_390 = local_d18->allocator;
                  local_360 = &local_1148;
                  local_1148.refcount = (int *)0x0;
                  local_1148.d = 1;
                  local_1e8 = (long)local_364 * (long)local_368 * local_380;
                  local_1148.cstep = (local_1e8 + 0xfU & 0xfffffffffffffff0) / local_380;
                  local_1148.dims = local_d18->dims + -1;
                  if (local_d18->dims == 4) {
                    local_1148.cstep = (long)local_d18->w * (long)local_d18->h;
                  }
                  local_1ec = 0x10;
                  local_22c = 0x10;
                  local_b55 = 1;
                  local_c6d = 1;
                  local_1148.data = local_378;
                  local_1148.elemsize = local_380;
                  local_1148.elempack = local_384;
                  local_1148.allocator = local_390;
                  local_1148.w = local_364;
                  local_1148.h = local_368;
                  local_1148.c = local_36c;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                    lVar2 = *(long *)(*in_RDI + -0x18);
                    v_05[2] = (float)(int)in_XMM1_Qa;
                    v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    v_05[0] = (float)(undefined4)local_15b0;
                    v_05[1] = (float)local_15b0._4_4_;
                    padding_constant_pack4_sse
                              (&local_1148,&local_10e8,*(int *)((long)in_RDI + lVar2 + 0xd0),
                               *(int *)((long)in_RDI + lVar2 + 0xd4),
                               *(int *)((long)in_RDI + lVar2 + 0xd8),
                               *(int *)((long)in_RDI + lVar2 + 0xdc),v_05);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                    padding_replicate_pack4_sse
                              ((Mat *)CONCAT44(in_stack_ffffffffffffe944,in_stack_ffffffffffffe940),
                               in_stack_ffffffffffffe938,in_stack_ffffffffffffe934,
                               in_stack_ffffffffffffe930,
                               (int)((ulong)in_stack_ffffffffffffe928 >> 0x20),
                               (int)in_stack_ffffffffffffe928);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                    padding_reflect_pack4_sse
                              ((Mat *)CONCAT17(in_stack_ffffffffffffea07,in_stack_ffffffffffffea00),
                               in_stack_ffffffffffffe9f8,in_stack_ffffffffffffe9f4,
                               in_stack_ffffffffffffe9f0,
                               (int)((ulong)in_stack_ffffffffffffe9e8 >> 0x20),
                               (int)in_stack_ffffffffffffe9e8);
                  }
                  pMVar12 = &local_1148;
                  local_a70 = pMVar12;
                  local_7d0 = pMVar12;
                  if (local_1148.refcount != (int *)0x0) {
                    local_7d4 = 0xffffffff;
                    LOCK();
                    local_7d8 = *local_1148.refcount;
                    *local_1148.refcount = *local_1148.refcount + -1;
                    UNLOCK();
                    if (local_7d8 == 1) {
                      if (local_1148.allocator == (Allocator *)0x0) {
                        local_5d0 = local_1148.data;
                        if (local_1148.data != (void *)0x0) {
                          free(local_1148.data);
                        }
                      }
                      else {
                        (*(local_1148.allocator)->_vptr_Allocator[3])
                                  (local_1148.allocator,local_1148.data);
                      }
                    }
                  }
                  pMVar12->data = (void *)0x0;
                  pMVar12->elemsize = 0;
                  pMVar12->elempack = 0;
                  pMVar12->dims = 0;
                  pMVar12->w = 0;
                  pMVar12->h = 0;
                  pMVar12->d = 0;
                  pMVar12->c = 0;
                  pMVar12->cstep = 0;
                  pMVar12->refcount = (int *)0x0;
                }
                pMVar12 = &local_10e8;
                local_a60 = pMVar12;
                local_7f0 = pMVar12;
                if (local_10e8.refcount != (int *)0x0) {
                  local_7f4 = 0xffffffff;
                  LOCK();
                  local_7f8 = *local_10e8.refcount;
                  *local_10e8.refcount = *local_10e8.refcount + -1;
                  UNLOCK();
                  if (local_7f8 == 1) {
                    if (local_10e8.allocator == (Allocator *)0x0) {
                      local_5c0 = (undefined8 *)local_10e8.data;
                      if ((undefined8 *)local_10e8.data != (undefined8 *)0x0) {
                        free(local_10e8.data);
                      }
                    }
                    else {
                      (*(local_10e8.allocator)->_vptr_Allocator[3])
                                (local_10e8.allocator,local_10e8.data);
                    }
                  }
                }
                pMVar12->data = (void *)0x0;
                pMVar12->elemsize = 0;
                pMVar12->elempack = 0;
                pMVar12->dims = 0;
                pMVar12->w = 0;
                pMVar12->h = 0;
                pMVar12->d = 0;
                pMVar12->c = 0;
                pMVar12->cstep = 0;
                pMVar12->refcount = (int *)0x0;
              }
              return 0;
            }
            return -100;
          }
        }
        if (local_d40 == 4) {
          local_114c = local_d30 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_1150 = local_d34 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_1154 = local_d38 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
            Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                        in_stack_ffffffffffffe944,in_stack_ffffffffffffe940,_d,
                        (int)in_stack_ffffffffffffe938,
                        CONCAT44(in_stack_ffffffffffffe934,in_stack_ffffffffffffe930),
                        in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9b0);
            local_cd8 = local_d20;
            bVar6 = true;
            if (local_d20->data != (void *)0x0) {
              local_508 = local_d20;
              bVar6 = local_d20->cstep * (long)local_d20->c == 0;
            }
            if (!bVar6) {
              for (local_1158 = 0; local_1158 < local_d3c; local_1158 = local_1158 + 1) {
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  local_9a0 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  local_1620 = CONCAT44(local_9a0,local_9a0);
                  uStack_1168 = CONCAT44(local_9a0,local_9a0);
                  uStack_99c = local_9a0;
                  uStack_998 = local_9a0;
                  uStack_994 = local_9a0;
                  local_984 = local_9a0;
                }
                else {
                  local_c18 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
                  local_928 = (undefined8 *)(*local_c18 + (long)(local_1158 << 2) * 4);
                  local_1620 = *local_928;
                  uStack_1168 = local_928[1];
                }
                local_1170 = local_1620;
                for (local_1174 = 0; local_1174 < local_1154; local_1174 = local_1174 + 1) {
                  local_c78 = &local_1208;
                  local_24c = local_d20->w;
                  local_250 = local_d20->h;
                  local_254 = local_d20->d;
                  local_260 = (void *)((long)local_d20->data +
                                      local_d20->cstep * (long)local_1158 * local_d20->elemsize);
                  local_268 = local_d20->elemsize;
                  local_26c = local_d20->elempack;
                  local_278 = local_d20->allocator;
                  local_248 = &local_1208;
                  local_238 = (long)local_24c * (long)local_250 * local_268;
                  local_9f0 = &local_11c0;
                  local_9f8 = &local_1208;
                  local_98 = (undefined8 *)
                             ((long)local_260 +
                             (long)local_24c * (long)local_250 * (long)local_1174 * local_268);
                  local_88 = &local_11c0;
                  local_11c0.cstep = (long)local_24c * (long)local_250;
                  local_a50 = &local_1208;
                  local_11c0.c = 1;
                  local_11c0.d = 1;
                  local_11c0.dims = 2;
                  local_11c0.refcount = (int *)0x0;
                  local_23c = 0x10;
                  local_9fc = local_1174;
                  local_c84 = local_1158;
                  local_c85 = 1;
                  local_1208 = 0;
                  local_11f8 = 0;
                  local_11f0 = 0;
                  local_11e0 = 0;
                  local_11dc = 0;
                  local_11d8 = 0;
                  local_11d4 = 0;
                  local_11d0 = 0;
                  local_11c8 = 0;
                  local_1200 = 0;
                  local_810 = local_a50;
                  local_b0 = local_278;
                  local_a4 = local_26c;
                  local_a0 = local_268;
                  local_90 = local_250;
                  local_8c = local_24c;
                  local_11e8 = local_278;
                  local_11c0.data = local_98;
                  local_11c0.elemsize = local_268;
                  local_11c0.elempack = local_26c;
                  local_11c0.allocator = local_278;
                  local_11c0.w = local_24c;
                  local_11c0.h = local_250;
                  if ((local_1174 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0)
                     || (local_d38 <=
                         local_1174 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8))) {
                    local_8f0 = &local_11c0;
                    local_900 = local_1170;
                    uStack_8f8 = uStack_1168;
                    local_904 = (int)local_11c0.cstep;
                    local_910 = local_98;
                    for (local_914 = 0; local_558 = local_8f0, local_914 < local_904;
                        local_914 = local_914 + 1) {
                      local_48 = local_910;
                      local_60 = local_1170;
                      uStack_58 = uStack_1168;
                      *local_910 = local_1170;
                      local_910[1] = uStack_1168;
                      local_910 = local_910 + 2;
                    }
                  }
                  else {
                    local_b60 = &local_1298;
                    local_32c = local_d18->w;
                    local_330 = local_d18->h;
                    local_334 = local_d18->d;
                    local_340 = (void *)((long)local_d18->data +
                                        local_d18->cstep * (long)local_1158 * local_d18->elemsize);
                    local_348 = local_d18->elemsize;
                    local_34c = local_d18->elempack;
                    local_358 = local_d18->allocator;
                    local_328 = &local_1298;
                    uVar13 = 1;
                    local_f0 = (int)in_stack_ffffffffffffed98;
                    local_1f8 = (long)local_32c * (long)local_f0 * local_348;
                    local_9cc = local_1174 -
                                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8);
                    local_9c0 = &local_1250;
                    local_9c8 = &local_1298;
                    local_f8 = (void *)((long)local_340 +
                                       (long)local_32c * (long)local_f0 * (long)local_9cc *
                                       local_348);
                    local_e8 = &local_1250;
                    local_1250.cstep = (long)local_32c * (long)local_f0;
                    local_a40 = &local_1298;
                    local_11c0.c = 1;
                    local_11c0.d = 1;
                    local_11c0.dims = 2;
                    local_11c0.refcount = (int *)0x0;
                    local_11d0 = 0;
                    local_11d4 = 0;
                    local_11d8 = 0;
                    local_11dc = 0;
                    local_11f0 = 0;
                    local_11f8 = 0;
                    local_1200 = 0;
                    local_1208 = 0;
                    local_1250.c = 1;
                    local_1250.d = 1;
                    local_1250.dims = 2;
                    local_1250.refcount = (int *)0x0;
                    local_1fc = 0x10;
                    local_23c = 0x10;
                    local_b6c = local_1158;
                    local_b6d = 1;
                    local_c85 = 1;
                    local_11c8 = 0;
                    local_11e0 = 0;
                    local_1298 = 0;
                    local_1288 = 0;
                    local_1280 = 0;
                    uVar13 = 0;
                    local_1290 = 0;
                    lVar2 = *(long *)(*in_RDI + -0x18);
                    v_06[2] = (float)(int)in_XMM1_Qa;
                    v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    v_06[0] = (float)(undefined4)local_1170;
                    v_06[1] = (float)local_1170._4_4_;
                    local_830 = local_a40;
                    local_104 = local_34c;
                    local_100 = local_348;
                    local_1250.data = local_f8;
                    local_1250.elemsize = local_348;
                    local_1250.elempack = local_34c;
                    local_1250.allocator = local_358;
                    local_1250.w = local_32c;
                    local_1250.h = local_f0;
                    padding_constant_pack4_sse
                              (&local_1250,&local_11c0,*(int *)((long)in_RDI + lVar2 + 0xd0),
                               *(int *)((long)in_RDI + lVar2 + 0xd4),
                               *(int *)((long)in_RDI + lVar2 + 0xd8),
                               *(int *)((long)in_RDI + lVar2 + 0xdc),v_06);
                    local_a30 = &local_1250;
                    local_850 = local_a30;
                    if (local_1250.refcount != (int *)0x0) {
                      local_854 = 0xffffffff;
                      LOCK();
                      local_858 = *local_1250.refcount;
                      *local_1250.refcount = *local_1250.refcount + -1;
                      UNLOCK();
                      if (local_858 == 1) {
                        if (local_1250.allocator == (Allocator *)0x0) {
                          local_590 = local_1250.data;
                          if (local_1250.data != (void *)0x0) {
                            free(local_1250.data);
                          }
                        }
                        else {
                          (*(local_1250.allocator)->_vptr_Allocator[3])
                                    (local_1250.allocator,local_1250.data);
                        }
                      }
                    }
                    local_1250.data = (void *)0x0;
                    local_1250.elemsize = 0;
                    local_1250.elempack = 0;
                    local_1250.dims = 0;
                    local_1250.w = 0;
                    local_1250.h = 0;
                    local_1250.d = 0;
                    local_1250.c = 0;
                    local_1250.cstep = 0;
                    local_1250.refcount = (int *)0x0;
                  }
                  pMVar12 = &local_11c0;
                  local_a20 = pMVar12;
                  local_870 = pMVar12;
                  if (local_11c0.refcount != (int *)0x0) {
                    local_874 = 0xffffffff;
                    LOCK();
                    local_878 = *local_11c0.refcount;
                    *local_11c0.refcount = *local_11c0.refcount + -1;
                    UNLOCK();
                    if (local_878 == 1) {
                      if (local_11c0.allocator == (Allocator *)0x0) {
                        local_580 = (undefined8 *)local_11c0.data;
                        if ((undefined8 *)local_11c0.data != (undefined8 *)0x0) {
                          free(local_11c0.data);
                        }
                      }
                      else {
                        (*(local_11c0.allocator)->_vptr_Allocator[3])
                                  (local_11c0.allocator,local_11c0.data);
                      }
                    }
                  }
                  pMVar12->data = (void *)0x0;
                  pMVar12->elemsize = 0;
                  pMVar12->elempack = 0;
                  pMVar12->dims = 0;
                  pMVar12->w = 0;
                  pMVar12->h = 0;
                  pMVar12->d = 0;
                  pMVar12->c = 0;
                  pMVar12->cstep = 0;
                  pMVar12->refcount = (int *)0x0;
                }
              }
              return 0;
            }
            return -100;
          }
        }
      }
      local_8b0 = (Option *)local_12e0;
      local_12e0._0_8_ = in_RSI->data;
      local_12e0._8_8_ = in_RSI->refcount;
      local_12e0._16_8_ = in_RSI->elemsize;
      local_12e0._24_4_ = in_RSI->elempack;
      local_12e0._32_8_ = in_RSI->allocator;
      local_12b8 = in_RSI->dims;
      local_12b4 = in_RSI->w;
      local_12b0 = in_RSI->h;
      local_12ac = in_RSI->d;
      local_12a8 = in_RSI->c;
      local_12a0 = in_RSI->cstep;
      if ((Allocator *)local_12e0._8_8_ != (Allocator *)0x0) {
        local_3c = 1;
        LOCK();
        local_40 = *(int *)&((Allocator *)local_12e0._8_8_)->_vptr_Allocator;
        *(int *)&((Allocator *)local_12e0._8_8_)->_vptr_Allocator =
             *(int *)&((Allocator *)local_12e0._8_8_)->_vptr_Allocator + 1;
        UNLOCK();
      }
      local_38 = local_8b0;
      if (local_d4c != 1) {
        in_stack_ffffffffffffed00 = *(Option **)(in_RCX + 0x20);
        in_stack_ffffffffffffed08 = *(Mat **)(in_RCX + 0x28);
        in_stack_ffffffffffffed10 = *(Mat **)(in_RCX + 0x30);
        in_stack_ffffffffffffed18 = *(Padding **)(in_RCX + 0x38);
        convert_packing(in_stack_ffffffffffffe968,in_stack_ffffffffffffe960,
                        (int)((ulong)local_8b0 >> 0x20),local_8b0);
      }
      local_d04 = Padding::forward(in_stack_ffffffffffffed18,in_stack_ffffffffffffed10,
                                   in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
      puVar11 = (undefined8 *)local_12e0;
      if ((Allocator *)local_12e0._8_8_ != (Allocator *)0x0) {
        local_894 = 0xffffffff;
        LOCK();
        local_898 = *(int *)(_func_int ***)local_12e0._8_8_;
        *(int *)(_func_int ***)local_12e0._8_8_ = *(int *)(_func_int ***)local_12e0._8_8_ + -1;
        UNLOCK();
        if (local_898 == 1) {
          local_a10 = puVar11;
          local_890 = puVar11;
          if ((Allocator *)local_12e0._32_8_ == (Allocator *)0x0) {
            local_570 = (void *)local_12e0._0_8_;
            if ((void *)local_12e0._0_8_ != (void *)0x0) {
              free((void *)local_12e0._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_12e0._32_8_)[3])(local_12e0._32_8_,local_12e0._0_8_);
          }
        }
      }
      *puVar11 = 0;
      puVar11[2] = 0;
      *(undefined4 *)(puVar11 + 3) = 0;
      *(undefined4 *)(puVar11 + 5) = 0;
      *(undefined4 *)((long)puVar11 + 0x2c) = 0;
      *(undefined4 *)(puVar11 + 6) = 0;
      *(undefined4 *)((long)puVar11 + 0x34) = 0;
      *(undefined4 *)(puVar11 + 7) = 0;
      puVar11[8] = 0;
      puVar11[1] = 0;
    }
  }
  return local_d04;
}

Assistant:

int Padding_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}